

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

int __thiscall
ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open
          (basic_ofstream<char,_std::char_traits<char>_> *this,char *__file,int __oflag,...)

{
  _Ios_Openmode _Var1;
  int iVar2;
  string local_40;
  int local_1c;
  char *pcStack_18;
  openmode mode_local;
  path *p_local;
  basic_ofstream<char,_std::char_traits<char>_> *this_local;
  
  local_1c = __oflag;
  pcStack_18 = __file;
  p_local = (path *)this;
  path::string_abi_cxx11_(&local_40,(path *)__file);
  _Var1 = std::__cxx11::string::c_str();
  std::ofstream::open((char *)this,_Var1);
  iVar2 = std::__cxx11::string::~string((string *)&local_40);
  return iVar2;
}

Assistant:

void open(const path& p, std::ios_base::openmode mode = std::ios_base::out) { std::basic_ofstream<charT, traits>::open(p.string().c_str(), mode); }